

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtx_loadDictionary_byReference(ZSTD_CCtx *cctx,void *dict,size_t dictSize)

{
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearAllDicts(cctx);
  if (dictSize != 0 && dict != (void *)0x0) {
    (cctx->localDict).dict = dict;
    (cctx->localDict).dictSize = dictSize;
    (cctx->localDict).dictContentType = ZSTD_dct_auto;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_byReference(
      ZSTD_CCtx* cctx, const void* dict, size_t dictSize)
{
    return ZSTD_CCtx_loadDictionary_advanced(
            cctx, dict, dictSize, ZSTD_dlm_byRef, ZSTD_dct_auto);
}